

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_113ab01::TSymbolDefinitionCollectingTraverser::visitBinary
          (TSymbolDefinitionCollectingTraverser *this,TVisit param_1,TIntermBinary *node)

{
  ObjectAccessChain *chain;
  TOperator op;
  uint __val;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar8;
  undefined4 extraout_var_03;
  mapped_type *pmVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  __node_gen_type __node_gen;
  ObjectAccessChain id_symbol;
  TIntermBinary *local_78;
  uint local_70;
  undefined1 local_68 [24];
  ObjectAccessChain local_50;
  
  chain = &this->current_object_;
  (this->current_object_)._M_string_length = 0;
  *(this->current_object_)._M_dataplus._M_p = '\0';
  iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(node,CONCAT44(in_register_00000034,param_1));
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar5),this);
  op = (node->super_TIntermOperator).op;
  bVar3 = isAssignOperation(op);
  if (bVar3) {
    if ((this->current_object_)._M_string_length == 0) {
      __assert_fail("!current_object_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x173,
                    "virtual bool (anonymous namespace)::TSymbolDefinitionCollectingTraverser::visitBinary(glslang::TVisit, glslang::TIntermBinary *)"
                   );
    }
    iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0xf0))
                               ((long *)CONCAT44(extraout_var_00,iVar5));
    lVar7 = (**(code **)(*plVar6 + 0x58))(plVar6);
    if ((*(byte *)(lVar7 + 0xc) & 0x10) != 0) {
      local_78 = (TIntermBinary *)this->precise_objects_;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_78,chain);
    }
    getFrontElement(&local_50,chain);
    p_Var1 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)this->symbol_definition_mapping_;
    local_78 = (TIntermBinary *)local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    local_68._16_8_ = node;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::pair<std::__cxx11::string,glslang::TIntermBinary*>>(p_Var1,0,&local_78);
    if (local_78 != (TIntermBinary *)local_68) {
      operator_delete(local_78,local_68._0_8_ + 1);
    }
    (this->current_object_)._M_string_length = 0;
    *(this->current_object_)._M_dataplus._M_p = '\0';
    iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(node);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x10))
              ((long *)CONCAT44(extraout_var_01,iVar5),this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return false;
  }
  if ((int)op < 0x36) {
    if (1 < op - EOpIndexDirect) {
      if (op == EOpIndexDirectStruct) {
        iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x33])(node);
        plVar6 = (long *)CONCAT44(extraout_var_02,iVar5);
        lVar7 = (**(code **)(*plVar6 + 0x28))(plVar6);
        if (lVar7 != 0) {
          plVar8 = (long *)(**(code **)(*plVar6 + 0x28))(plVar6);
          cVar4 = (**(code **)(*plVar8 + 0x160))(plVar8);
          if (cVar4 != '\0') {
            lVar7 = (**(code **)(*plVar6 + 0x28))(plVar6);
            __val = **(uint **)(*(long *)(lVar7 + 0xc0) + 8);
            std::__cxx11::string::push_back((char)chain);
            cVar4 = '\x01';
            if (9 < __val) {
              uVar10 = __val;
              cVar2 = '\x04';
              do {
                cVar4 = cVar2;
                if (uVar10 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_004462ce;
                }
                if (uVar10 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_004462ce;
                }
                if (uVar10 < 10000) goto LAB_004462ce;
                bVar3 = 99999 < uVar10;
                uVar10 = uVar10 / 10000;
                cVar2 = cVar4 + '\x04';
              } while (bVar3);
              cVar4 = cVar4 + '\x01';
            }
LAB_004462ce:
            local_78 = (TIntermBinary *)local_68;
            std::__cxx11::string::_M_construct((ulong)&local_78,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,local_70,__val);
            std::__cxx11::string::_M_append((char *)chain,(ulong)local_78);
            if (local_78 != (TIntermBinary *)local_68) {
              operator_delete(local_78,local_68._0_8_ + 1);
            }
            goto LAB_0044631d;
          }
        }
        __assert_fail("node->getAsConstantUnion() && node->getAsConstantUnion()->isScalar()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                      ,0x86,
                      "unsigned int (anonymous namespace)::getStructIndexFromConstantUnion(glslang::TIntermTyped *)"
                     );
      }
LAB_0044629e:
      (this->current_object_)._M_string_length = 0;
      *(this->current_object_)._M_dataplus._M_p = '\0';
      iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x33])(node);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x10))
                ((long *)CONCAT44(extraout_var_03,iVar5),this);
      return false;
    }
  }
  else if ((op != EOpVectorSwizzle) && (op != EOpMatrixSwizzle)) goto LAB_0044629e;
LAB_0044631d:
  local_78 = node;
  pmVar9 = std::__detail::
           _Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->accesschain_mapping_,(key_type *)&local_78);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  return false;
}

Assistant:

bool TSymbolDefinitionCollectingTraverser::visitBinary(glslang::TVisit /* visit */,
                                                       glslang::TIntermBinary* node)
{
    // Traverses the left node to build the access chain info for the object.
    current_object_.clear();
    node->getLeft()->traverse(this);

    if (isAssignOperation(node->getOp())) {
        // We should always be able to get an access chain for the left node.
        assert(!current_object_.empty());

        // If the left node object is 'precise', it is an initial precise object
        // specified in the shader source. Adds it to the initial work list to
        // process later.
        if (isPreciseObjectNode(node->getLeft())) {
            // The left node is an 'precise' object node, add its access chain to
            // the set of 'precise' objects. This is to collect the initial set
            // of 'precise' objects.
            precise_objects_.insert(current_object_);
        }
        // Gets the symbol ID from the object access chain, which should be the
        // first element recorded in the access chain.
        ObjectAccessChain id_symbol = getFrontElement(current_object_);
        // Adds a mapping from the symbol ID to this assignment operation node.
        symbol_definition_mapping_.insert(std::make_pair(id_symbol, node));

        // Traverses the right node, there may be other 'assignment'
        // operations in the right.
        current_object_.clear();
        node->getRight()->traverse(this);

    } else if (isDereferenceOperation(node->getOp())) {
        // The left node (parent node) is a struct type object. We need to
        // record the access chain information of the current node into its
        // object id.
        if (node->getOp() == glslang::EOpIndexDirectStruct) {
            unsigned struct_dereference_index = getStructIndexFromConstantUnion(node->getRight());
            current_object_.push_back(ObjectAccesschainDelimiter);
            current_object_.append(std::to_string(struct_dereference_index));
        }
        accesschain_mapping_[node] = current_object_;

        // For a dereference node, there is no need to traverse the right child
        // node as the right node should always be an integer type object.

    } else {
        // For other binary nodes, still traverse the right node.
        current_object_.clear();
        node->getRight()->traverse(this);
    }
    return false;
}